

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

void i4mat_print_some(int m,int n,int *a,int ilo,int jlo,int ihi,int jhi,string *title)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  int *piVar10;
  int *local_60;
  
  std::operator<<((ostream *)&std::cout,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)title);
  std::operator<<(poVar4,"\n");
  if (n < 1 || m < 1) {
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"  (None)\n");
    return;
  }
  uVar8 = (ulong)jlo;
  uVar7 = (ulong)(uint)m;
  local_60 = a + (uVar8 - 1) * uVar7 + -1;
  for (; (int)uVar8 <= jhi; uVar8 = uVar8 + 10) {
    iVar1 = i4_min((int)uVar8 + 9,n);
    iVar1 = i4_min(iVar1,jhi);
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"  Col:");
    uVar6 = uVar8 & 0xffffffff;
    while (iVar2 = (int)uVar6, iVar2 <= iVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"  ");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 6;
      std::ostream::operator<<(poVar4,iVar2 + -1);
      uVar6 = (ulong)(iVar2 + 1);
    }
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"  Row\n");
    std::operator<<((ostream *)&std::cout,"\n");
    iVar2 = i4_max(ilo,1);
    iVar3 = i4_min(ihi,m);
    lVar5 = (long)iVar2;
    piVar9 = local_60 + lVar5;
    for (; lVar5 <= iVar3; lVar5 = lVar5 + 1) {
      *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 5;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar5 + -1);
      std::operator<<(poVar4,":");
      piVar10 = piVar9;
      for (uVar6 = uVar8; (long)uVar6 <= (long)iVar1; uVar6 = uVar6 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"  ");
        *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 6;
        std::ostream::operator<<(poVar4,*piVar10);
        piVar10 = piVar10 + uVar7;
      }
      std::operator<<((ostream *)&std::cout,"\n");
      piVar9 = piVar9 + 1;
    }
    local_60 = local_60 + uVar7 * 10;
  }
  return;
}

Assistant:

void i4mat_print_some ( int m, int n, int a[], int ilo, int jlo, int ihi,
  int jhi, std::string title )

//****************************************************************************80
//
//  Purpose:
//
//    I4MAT_PRINT_SOME prints some of an I4MAT.
//
//  Discussion:
//
//    An I4MAT is an MxN array of I4's, stored by (I,J) -> [I+J*M].
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 August 2010
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, the number of rows of the matrix.
//    M must be positive.
//
//    Input, int N, the number of columns of the matrix.
//    N must be positive.
//
//    Input, int A[M*N], the matrix.
//
//    Input, int ILO, JLO, IHI, JHI, designate the first row and
//    column, and the last row and column to be printed.
//
//    Input, string TITLE, a title.
//
{
# define INCX 10

  int i;
  int i2hi;
  int i2lo;
  int j;
  int j2hi;
  int j2lo;

  std::cout << "\n";
  std::cout << title << "\n";

  if ( m <= 0 || n <= 0 )
  {
    std::cout << "\n";
    std::cout << "  (None)\n";
    return;
  }
//
//  Print the columns of the matrix, in strips of INCX.
//
  for ( j2lo = jlo; j2lo <= jhi; j2lo = j2lo + INCX )
  {
    j2hi = j2lo + INCX - 1;
    j2hi = i4_min ( j2hi, n );
    j2hi = i4_min ( j2hi, jhi );

    std::cout << "\n";
//
//  For each column J in the current range...
//
//  Write the header.
//
    std::cout << "  Col:";
    for ( j = j2lo; j <= j2hi; j++ )
    {
      std::cout << "  " << std::setw(6) << j - 1;
    }
    std::cout << "\n";
    std::cout << "  Row\n";
    std::cout << "\n";
//
//  Determine the range of the rows in this strip.
//
    i2lo = i4_max ( ilo, 1 );
    i2hi = i4_min ( ihi, m );

    for ( i = i2lo; i <= i2hi; i++ )
    {
//
//  Print out (up to INCX) entries in row I, that lie in the current strip.
//
      std::cout << std::setw(5) << i - 1 << ":";
      for ( j = j2lo; j <= j2hi; j++ )
      {
        std::cout << "  " << std::setw(6) << a[i-1+(j-1)*m];
      }
      std::cout << "\n";
    }
  }

  return;
# undef INCX
}